

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O3

void StoreSideInfo(VP8EncIterator *it)

{
  VP8Encoder *pVVar1;
  VP8MBInfo *pVVar2;
  WebPPicture *pWVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  VP8Encoder *enc;
  
  pVVar1 = it->enc;
  pVVar2 = it->mb;
  pWVar3 = pVVar1->pic;
  if (pWVar3->stats != (WebPAuxStats *)0x0) {
    puVar4 = it->yuv_in;
    puVar5 = it->yuv_out;
    iVar6 = (*VP8SSE16x16)(puVar4,puVar5);
    pVVar1->sse[0] = pVVar1->sse[0] + (long)iVar6;
    iVar6 = (*VP8SSE8x8)(puVar4 + 0x10,puVar5 + 0x10);
    pVVar1->sse[1] = pVVar1->sse[1] + (long)iVar6;
    iVar6 = (*VP8SSE8x8)(puVar4 + 0x18,puVar5 + 0x18);
    pVVar1->sse[2] = pVVar1->sse[2] + (long)iVar6;
    pVVar1->sse_count = pVVar1->sse_count + 0x100;
    pVVar1->block_count[0] = pVVar1->block_count[0] + (uint)(((uint)*pVVar2 & 3) == 0);
    pVVar1->block_count[1] = pVVar1->block_count[1] + (uint)(((uint)*pVVar2 & 3) == 1);
    pVVar1->block_count[2] = pVVar1->block_count[2] + (uint)(((uint)*pVVar2 >> 4 & 1) != 0);
  }
  if (pWVar3->extra_info == (uint8_t *)0x0) {
    return;
  }
  switch(pWVar3->extra_info_type) {
  case 1:
    bVar7 = *(byte *)pVVar2;
    goto LAB_00164969;
  case 2:
    bVar7 = *(byte *)pVVar2 >> 5;
    goto LAB_00164969;
  case 3:
    bVar7 = (byte)pVVar1->dqm[*(byte *)pVVar2 >> 5 & 3].quant;
    break;
  case 4:
    bVar7 = 0xff;
    if (((uint)*pVVar2 & 3) == 1) {
      bVar7 = *it->preds;
    }
    break;
  case 5:
    bVar7 = *(byte *)pVVar2 >> 2;
LAB_00164969:
    bVar7 = bVar7 & 3;
    break;
  case 6:
    uVar8 = it->uv_bits + it->luma_bits + 7 >> 3;
    bVar7 = 0xff;
    if ((int)uVar8 < 0xff) {
      bVar7 = (byte)uVar8;
    }
    break;
  case 7:
    bVar7 = pVVar2->alpha;
    break;
  default:
    bVar7 = 0;
  }
  pWVar3->extra_info[(long)pVVar1->mb_w * (long)it->y + (long)it->x] = bVar7;
  return;
}

Assistant:

static void StoreSideInfo(const VP8EncIterator* const it) {
  VP8Encoder* const enc = it->enc;
  const VP8MBInfo* const mb = it->mb;
  WebPPicture* const pic = enc->pic;

  if (pic->stats != NULL) {
    StoreSSE(it);
    enc->block_count[0] += (mb->type == 0);
    enc->block_count[1] += (mb->type == 1);
    enc->block_count[2] += (mb->skip != 0);
  }

  if (pic->extra_info != NULL) {
    uint8_t* const info = &pic->extra_info[it->x + it->y * enc->mb_w];
    switch (pic->extra_info_type) {
      case 1: *info = mb->type; break;
      case 2: *info = mb->segment; break;
      case 3: *info = enc->dqm[mb->segment].quant; break;
      case 4: *info = (mb->type == 1) ? it->preds[0] : 0xff; break;
      case 5: *info = mb->uv_mode; break;
      case 6: {
        const int b = (int)((it->luma_bits + it->uv_bits + 7) >> 3);
        *info = (b > 255) ? 255 : b; break;
      }
      case 7: *info = mb->alpha; break;
      default: *info = 0; break;
    }
  }
#if SEGMENT_VISU  // visualize segments and prediction modes
  SetBlock(it->yuv_out + Y_OFF_ENC, mb->segment * 64, 16);
  SetBlock(it->yuv_out + U_OFF_ENC, it->preds[0] * 64, 8);
  SetBlock(it->yuv_out + V_OFF_ENC, mb->uv_mode * 64, 8);
#endif
}